

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

int __thiscall
cmCTest::RunTest(cmCTest *this,vector<const_char_*,_std::allocator<const_char_*>_> *argv,
                string *output,int *retVal,ostream *log,cmDuration testTimeOut,
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *environment,Encoding encoding)

{
  _Tuple_impl<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
  *p_Var1;
  _Alloc_hider _Var2;
  bool bVar3;
  uint __val;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  string *psVar7;
  cmsysProcess *cp;
  undefined4 uVar8;
  undefined8 unaff_R12;
  _Tuple_impl<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
  *p_Var9;
  cmDuration cVar10;
  cmDuration cVar11;
  undefined8 extraout_XMM0_Qb;
  undefined8 uVar12;
  cmProcessOutput processOutput;
  unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
  saveEnv;
  cmDuration local_410;
  string *local_408;
  ostream *local_400;
  allocator<char> local_3f1;
  string outerr;
  int length;
  vector<char,_std::allocator<char>_> tempOutput;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  char *data;
  double local_378;
  undefined8 uStack_370;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_360;
  _Vector_base<char,_std::allocator<char>_> local_358;
  string local_340;
  ostringstream cmCTestLog_msg;
  string strdata;
  
  if (environment ==
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    uVar8 = 0;
  }
  else {
    uVar8 = (undefined4)
            CONCAT71((int7)((ulong)unaff_R12 >> 8),
                     (environment->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start !=
                     (environment->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish);
  }
  local_408 = (string *)testTimeOut.__r;
  local_400 = log;
  cVar10 = GetRemainingTimeAllowed(this);
  local_410.__r =
       (rep_conflict)
       (~-(ulong)(cVar10.__r != 10000000.0) & (ulong)cVar10.__r |
       (ulong)(cVar10.__r + -120.0) & -(ulong)(cVar10.__r != 10000000.0));
  cVar10.__r = (((this->Impl)._M_t.
                 super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
                 super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->TimeOut).__r;
  uVar12 = extraout_XMM0_Qb;
  if ((0.0 < cVar10.__r) && (cVar10.__r < local_410.__r)) {
    uVar12 = 0;
    local_410.__r = cVar10.__r;
  }
  cVar10.__r = local_410.__r;
  if ((0.0 < (double)local_408) &&
     (local_378 = local_410.__r, uStack_370 = uVar12, cVar11 = GetRemainingTimeAllowed(this),
     cVar10.__r = local_378, (double)local_408 < cVar11.__r)) {
    local_410.__r = (rep_conflict)local_408;
    cVar10.__r = (rep_conflict)local_408;
  }
  if (cVar10.__r <= 0.0) {
    local_410.__r = 1.0;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,"Test timeout computed to be: ");
  local_408 = (string *)local_410.__r;
  if ((local_410.__r != 10000000.0) || (NAN(local_410.__r))) {
    __val = cmDurationTo<unsigned_int>(&local_410);
    std::__cxx11::to_string(&strdata,__val);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&strdata,"infinite",&local_3f1);
  }
  poVar6 = std::operator<<(poVar6,(string *)&strdata);
  std::operator<<(poVar6,"\n");
  std::__cxx11::string::~string((string *)&strdata);
  std::__cxx11::stringbuf::str();
  Log(this,5,
      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmCTest.cxx"
      ,0x4b3,strdata._M_dataplus._M_p,false);
  std::__cxx11::string::~string((string *)&strdata);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg,
             *(argv->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
              super__Vector_impl_data._M_start,(allocator<char> *)&strdata);
  psVar7 = cmSystemTools::GetCTestCommand_abi_cxx11_();
  bVar3 = cmsys::SystemTools::SameFile((string *)&cmCTestLog_msg,psVar7);
  if (bVar3) {
    bVar3 = ((this->Impl)._M_t.
             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
             super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->ForceNewCTestProcess;
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    if (bVar3 == false) {
      cmCTest((cmCTest *)&tempOutput);
      std::__cxx11::string::_M_assign
                ((string *)
                 (tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start + 8));
      local_378 = (double)CONCAT44(local_378._4_4_,uVar8);
      *(rep_conflict *)
       (tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start + 0x22c8) = local_410.__r;
      local_408 = output;
      local_360 = environment;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      *(ostringstream **)
       (tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start + 0x2340) = (ostringstream *)&cmCTestLog_msg;
      *(ostringstream **)
       (tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start + 0x2348) = (ostringstream *)&cmCTestLog_msg;
      args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      p_Var1 = (_Tuple_impl<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
                *)(argv->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
      for (p_Var9 = (_Tuple_impl<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
                     *)(argv->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                       _M_impl.super__Vector_impl_data._M_start; p_Var9 != p_Var1;
          p_Var9 = p_Var9 + 1) {
        saveEnv._M_t.
        super___uniq_ptr_impl<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
        ._M_t.
        super__Tuple_impl<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
        .super__Head_base<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_false>._M_head_impl =
             *(__uniq_ptr_data<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>,_true,_true>
               *)&p_Var9->super__Head_base<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_false>;
        if ((tuple<cmSystemTools::SaveRestoreEnvironment_*,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
             )saveEnv._M_t.
              super___uniq_ptr_impl<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
              ._M_t.
              super__Tuple_impl<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
              .super__Head_base<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_false>._M_head_impl !=
            (_Head_base<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_false>)0x0) {
          iVar4 = strcmp((char *)saveEnv._M_t.
                                 super___uniq_ptr_impl<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
                                 .
                                 super__Head_base<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_false>
                                 ._M_head_impl,"--build-generator");
          if ((iVar4 == 0) &&
             (((local_410.__r != 10000000.0 || (NAN(local_410.__r))) && (0.0 < local_410.__r)))) {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const(&)[15]>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args,
                       (char (*) [15])"--test-timeout");
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&strdata);
            cmDurationTo<unsigned_int>(&local_410);
            std::ostream::_M_insert<unsigned_long>((ulong)&strdata);
            std::__cxx11::stringbuf::str();
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args,
                       &outerr);
            std::__cxx11::string::~string((string *)&outerr);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&strdata);
          }
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const*&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args,
                     (char **)&saveEnv);
        }
      }
      if (local_400 != (ostream *)0x0) {
        poVar6 = std::operator<<(local_400,"* Run internal CTest");
        std::endl<char,std::char_traits<char>>(poVar6);
      }
      psVar7 = local_408;
      saveEnv._M_t.
      super___uniq_ptr_impl<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
      ._M_t.
      super__Tuple_impl<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
      .super__Head_base<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_false>._M_head_impl =
           (__uniq_ptr_data<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>,_true,_true>
            )(__uniq_ptr_impl<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
              )0x0;
      if (local_378._0_1_ != '\0') {
        std::make_unique<cmSystemTools::SaveRestoreEnvironment>();
        _Var2 = strdata._M_dataplus;
        strdata._M_dataplus._M_p = (pointer)0x0;
        std::
        __uniq_ptr_impl<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
        ::reset((__uniq_ptr_impl<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
                 *)&saveEnv,(pointer)_Var2._M_p);
        std::
        unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
        ::~unique_ptr((unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
                       *)&strdata);
        cmSystemTools::AppendEnv(local_360);
      }
      iVar4 = Run((cmCTest *)&tempOutput,&args,psVar7);
      *retVal = iVar4;
      if (psVar7 != (string *)0x0) {
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::append((string *)psVar7);
        std::__cxx11::string::~string((string *)&strdata);
        if (local_400 != (ostream *)0x0) {
          std::operator<<(local_400,(string *)psVar7);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&strdata);
        poVar6 = std::operator<<((ostream *)&strdata,"Internal cmCTest object used to run test.");
        poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
        poVar6 = std::operator<<(poVar6,(string *)psVar7);
        std::endl<char,std::char_traits<char>>(poVar6);
        std::__cxx11::stringbuf::str();
        Log(this,5,
            "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmCTest.cxx"
            ,0x4e4,outerr._M_dataplus._M_p,false);
        std::__cxx11::string::~string((string *)&outerr);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&strdata);
      }
      std::
      unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
      ::~unique_ptr(&saveEnv);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&args);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      ~cmCTest((cmCTest *)&tempOutput);
      return 4;
    }
  }
  else {
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  }
  tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (output != (string *)0x0) {
    output->_M_string_length = 0;
    *(output->_M_dataplus)._M_p = '\0';
  }
  saveEnv._M_t.
  super___uniq_ptr_impl<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
  ._M_t.
  super__Tuple_impl<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
  .super__Head_base<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_false>._M_head_impl =
       (__uniq_ptr_data<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>,_true,_true>
        )(__uniq_ptr_impl<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
          )0x0;
  if ((char)uVar8 != '\0') {
    std::make_unique<cmSystemTools::SaveRestoreEnvironment>();
    _Var2._M_p = _cmCTestLog_msg;
    _cmCTestLog_msg = (pointer)0x0;
    std::
    __uniq_ptr_impl<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
    ::reset((__uniq_ptr_impl<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
             *)&saveEnv,(pointer)_Var2._M_p);
    std::
    unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
    ::~unique_ptr((unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
                   *)&cmCTestLog_msg);
    cmSystemTools::AppendEnv(environment);
  }
  cp = cmsysProcess_New();
  cmsysProcess_SetCommand
            (cp,(argv->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
                super__Vector_impl_data._M_start);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,"Command is: ");
  poVar6 = std::operator<<(poVar6,*(argv->
                                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                                   _M_impl.super__Vector_impl_data._M_start);
  std::endl<char,std::char_traits<char>>(poVar6);
  std::__cxx11::stringbuf::str();
  Log(this,0,
      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmCTest.cxx"
      ,0x4f6,strdata._M_dataplus._M_p,false);
  std::__cxx11::string::~string((string *)&strdata);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  if (cmSystemTools::s_RunCommandHideConsole == true) {
    cmsysProcess_SetOption(cp,0,1);
  }
  cmsysProcess_SetTimeout(cp,local_410.__r);
  cmsysProcess_Execute(cp);
  cmProcessOutput::cmProcessOutput(&processOutput,encoding,0x400);
  strdata._M_dataplus._M_p = (pointer)&strdata.field_2;
  strdata._M_string_length = 0;
  strdata.field_2._M_local_buf[0] = '\0';
  while (iVar4 = cmsysProcess_WaitForData(cp,&data,&length,(double *)0x0), iVar4 != 0) {
    cmProcessOutput::DecodeText(&processOutput,data,(long)length,&strdata,0);
    if (output != (string *)0x0) {
      cmAppend<char,char*>(&tempOutput,data,data + length);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    outerr._M_dataplus = strdata._M_dataplus;
    outerr._M_string_length = strdata._M_string_length;
    operator<<((ostream *)&cmCTestLog_msg,(cmCTestLogWrite *)&outerr);
    std::__cxx11::stringbuf::str();
    Log(this,5,
        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmCTest.cxx"
        ,0x508,outerr._M_dataplus._M_p,false);
    std::__cxx11::string::~string((string *)&outerr);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    if (local_400 != (ostream *)0x0) {
      std::ostream::write((char *)local_400,(long)strdata._M_dataplus._M_p);
    }
  }
  local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
  local_340._M_string_length = 0;
  local_340.field_2._M_local_buf[0] = '\0';
  cmProcessOutput::DecodeText(&processOutput,&local_340,&strdata,0);
  std::__cxx11::string::~string((string *)&local_340);
  if (strdata._M_string_length != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    outerr._M_dataplus = strdata._M_dataplus;
    outerr._M_string_length = strdata._M_string_length;
    operator<<((ostream *)&cmCTestLog_msg,(cmCTestLogWrite *)&outerr);
    std::__cxx11::stringbuf::str();
    Log(this,5,
        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmCTest.cxx"
        ,0x510,outerr._M_dataplus._M_p,false);
    std::__cxx11::string::~string((string *)&outerr);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    if (local_400 != (ostream *)0x0) {
      std::ostream::write((char *)local_400,(long)strdata._M_dataplus._M_p);
    }
  }
  cmsysProcess_WaitForExit(cp,(double *)0x0);
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_358,&tempOutput);
  cmProcessOutput::DecodeText
            (&processOutput,(vector<char,_std::allocator<char>_> *)&local_358,&tempOutput,0);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_358);
  if ((output != (string *)0x0) &&
     (tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish)) {
    std::__cxx11::string::append
              ((char *)output,
               (ulong)tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,"-- Process completed");
  std::endl<char,std::char_traits<char>>(poVar6);
  std::__cxx11::stringbuf::str();
  Log(this,5,
      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmCTest.cxx"
      ,0x51c,outerr._M_dataplus._M_p,false);
  std::__cxx11::string::~string((string *)&outerr);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  iVar4 = cmsysProcess_GetState(cp);
  if (iVar4 == 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&outerr,"\n*** ERROR executing: ",(allocator<char> *)&cmCTestLog_msg);
    cmsysProcess_GetErrorString(cp);
    std::__cxx11::string::append((char *)&outerr);
    if (output != (string *)0x0) {
      std::__cxx11::string::append((string *)output);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,(string *)&outerr);
    std::endl<char,std::char_traits<char>>(poVar6);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,5,
        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmCTest.cxx"
        ,0x53a,(char *)args.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,false);
  }
  else {
    if (iVar4 != 2) {
      if (iVar4 == 4) {
        iVar5 = cmsysProcess_GetExitValue(cp);
        *retVal = iVar5;
        if ((iVar5 != 0) &&
           (((this->Impl)._M_t.
             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
             super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->
            OutputTestOutputOnTestFailure == true)) {
          OutputTestErrors(this,&tempOutput);
        }
      }
      goto LAB_001487bc;
    }
    if (((this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->
        OutputTestOutputOnTestFailure == true) {
      OutputTestErrors(this,&tempOutput);
    }
    iVar5 = cmsysProcess_GetExitException(cp);
    *retVal = iVar5;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&outerr,"\n*** Exception executing: ",(allocator<char> *)&cmCTestLog_msg);
    cmsysProcess_GetExceptionString(cp);
    std::__cxx11::string::append((char *)&outerr);
    if (output != (string *)0x0) {
      std::__cxx11::string::append((string *)output);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,(string *)&outerr);
    std::endl<char,std::char_traits<char>>(poVar6);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,5,
        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmCTest.cxx"
        ,0x531,(char *)args.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,false);
  }
  std::__cxx11::string::~string((string *)&args);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&outerr);
LAB_001487bc:
  cmsysProcess_Delete(cp);
  std::__cxx11::string::~string((string *)&strdata);
  cmProcessOutput::~cmProcessOutput(&processOutput);
  std::
  unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
  ::~unique_ptr(&saveEnv);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&tempOutput.super__Vector_base<char,_std::allocator<char>_>);
  return iVar4;
}

Assistant:

int cmCTest::RunTest(std::vector<const char*> argv, std::string* output,
                     int* retVal, std::ostream* log, cmDuration testTimeOut,
                     std::vector<std::string>* environment, Encoding encoding)
{
  bool modifyEnv = (environment && !environment->empty());

  // determine how much time we have
  cmDuration timeout = this->GetRemainingTimeAllowed();
  if (timeout != cmCTest::MaxDuration()) {
    timeout -= std::chrono::minutes(2);
  }
  if (this->Impl->TimeOut > cmDuration::zero() &&
      this->Impl->TimeOut < timeout) {
    timeout = this->Impl->TimeOut;
  }
  if (testTimeOut > cmDuration::zero() &&
      testTimeOut < this->GetRemainingTimeAllowed()) {
    timeout = testTimeOut;
  }

  // always have at least 1 second if we got to here
  if (timeout <= cmDuration::zero()) {
    timeout = std::chrono::seconds(1);
  }
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
             "Test timeout computed to be: "
               << (timeout == cmCTest::MaxDuration()
                     ? std::string("infinite")
                     : std::to_string(cmDurationTo<unsigned int>(timeout)))
               << "\n");
  if (cmSystemTools::SameFile(argv[0], cmSystemTools::GetCTestCommand()) &&
      !this->Impl->ForceNewCTestProcess) {
    cmCTest inst;
    inst.Impl->ConfigType = this->Impl->ConfigType;
    inst.Impl->TimeOut = timeout;

    // Capture output of the child ctest.
    std::ostringstream oss;
    inst.SetStreams(&oss, &oss);

    std::vector<std::string> args;
    for (char const* i : argv) {
      if (i) {
        // make sure we pass the timeout in for any build and test
        // invocations. Since --build-generator is required this is a
        // good place to check for it, and to add the arguments in
        if (strcmp(i, "--build-generator") == 0 &&
            timeout != cmCTest::MaxDuration() &&
            timeout > cmDuration::zero()) {
          args.emplace_back("--test-timeout");
          std::ostringstream msg;
          msg << cmDurationTo<unsigned int>(timeout);
          args.push_back(msg.str());
        }
        args.emplace_back(i);
      }
    }
    if (log) {
      *log << "* Run internal CTest" << std::endl;
    }

    std::unique_ptr<cmSystemTools::SaveRestoreEnvironment> saveEnv;
    if (modifyEnv) {
      saveEnv = cm::make_unique<cmSystemTools::SaveRestoreEnvironment>();
      cmSystemTools::AppendEnv(*environment);
    }

    *retVal = inst.Run(args, output);
    if (output) {
      *output += oss.str();
    }
    if (log && output) {
      *log << *output;
    }
    if (output) {
      cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
                 "Internal cmCTest object used to run test." << std::endl
                                                             << *output
                                                             << std::endl);
    }

    return cmsysProcess_State_Exited;
  }
  std::vector<char> tempOutput;
  if (output) {
    output->clear();
  }

  std::unique_ptr<cmSystemTools::SaveRestoreEnvironment> saveEnv;
  if (modifyEnv) {
    saveEnv = cm::make_unique<cmSystemTools::SaveRestoreEnvironment>();
    cmSystemTools::AppendEnv(*environment);
  }

  cmsysProcess* cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp, argv.data());
  cmCTestLog(this, DEBUG, "Command is: " << argv[0] << std::endl);
  if (cmSystemTools::GetRunCommandHideConsole()) {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
  }

  cmsysProcess_SetTimeout(cp, timeout.count());
  cmsysProcess_Execute(cp);

  char* data;
  int length;
  cmProcessOutput processOutput(encoding);
  std::string strdata;
  while (cmsysProcess_WaitForData(cp, &data, &length, nullptr)) {
    processOutput.DecodeText(data, length, strdata);
    if (output) {
      cmAppend(tempOutput, data, data + length);
    }
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               cmCTestLogWrite(strdata.c_str(), strdata.size()));
    if (log) {
      log->write(strdata.c_str(), strdata.size());
    }
  }
  processOutput.DecodeText(std::string(), strdata);
  if (!strdata.empty()) {
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               cmCTestLogWrite(strdata.c_str(), strdata.size()));
    if (log) {
      log->write(strdata.c_str(), strdata.size());
    }
  }

  cmsysProcess_WaitForExit(cp, nullptr);
  processOutput.DecodeText(tempOutput, tempOutput);
  if (output && tempOutput.begin() != tempOutput.end()) {
    output->append(tempOutput.data(), tempOutput.size());
  }
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
             "-- Process completed" << std::endl);

  int result = cmsysProcess_GetState(cp);

  if (result == cmsysProcess_State_Exited) {
    *retVal = cmsysProcess_GetExitValue(cp);
    if (*retVal != 0 && this->Impl->OutputTestOutputOnTestFailure) {
      OutputTestErrors(tempOutput);
    }
  } else if (result == cmsysProcess_State_Exception) {
    if (this->Impl->OutputTestOutputOnTestFailure) {
      OutputTestErrors(tempOutput);
    }
    *retVal = cmsysProcess_GetExitException(cp);
    std::string outerr = "\n*** Exception executing: ";
    outerr += cmsysProcess_GetExceptionString(cp);
    if (output) {
      *output += outerr;
    }
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               outerr << std::endl
                      << std::flush);
  } else if (result == cmsysProcess_State_Error) {
    std::string outerr = "\n*** ERROR executing: ";
    outerr += cmsysProcess_GetErrorString(cp);
    if (output) {
      *output += outerr;
    }
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               outerr << std::endl
                      << std::flush);
  }
  cmsysProcess_Delete(cp);

  return result;
}